

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O2

void __thiscall OpenMD::DirectionalAtom::setA(DirectionalAtom *this,RotMat3x3d *a,int snapshotNo)

{
  SnapshotManager *pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RotMat3x3d atrans;
  RectMatrix<double,_3U,_3U> local_100;
  RectMatrix<double,_3U,_3U> local_b8;
  SquareMatrix3<double> local_70;
  
  pSVar1 = (this->super_Atom).super_StuntDouble.snapshotMan_;
  iVar3 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)snapshotNo);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)
             ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
             *(long *)(CONCAT44(extraout_var,iVar3) + 0x48 +
                      (this->super_Atom).super_StuntDouble.storage_)),
             (RectMatrix<double,_3U,_3U> *)a);
  bVar2 = AtomType::isMultipole((this->super_Atom).atomType_);
  if (bVar2) {
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_100,a);
    bVar2 = AtomType::isDipole((this->super_Atom).atomType_);
    if (bVar2) {
      operator*((Vector<double,_3U> *)&local_b8,&local_100,&(this->dipole_).super_Vector<double,_3U>
               );
      pSVar1 = (this->super_Atom).super_StuntDouble.snapshotMan_;
      iVar3 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)snapshotNo);
      Vector3<double>::operator=
                ((Vector3<double> *)
                 ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x18 +
                 *(long *)(CONCAT44(extraout_var_00,iVar3) + 0xf0 +
                          (this->super_Atom).super_StuntDouble.storage_)),
                 (Vector<double,_3U> *)&local_b8);
    }
    bVar2 = AtomType::isQuadrupole((this->super_Atom).atomType_);
    if (bVar2) {
      operator*(&local_70,(SquareMatrix3<double> *)&local_100,&this->quadrupole_);
      operator*((SquareMatrix3<double> *)&local_b8,&local_70,a);
      pSVar1 = (this->super_Atom).super_StuntDouble.snapshotMan_;
      iVar3 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)snapshotNo);
      RectMatrix<double,_3U,_3U>::operator=
                ((RectMatrix<double,_3U,_3U> *)
                 ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
                 *(long *)(CONCAT44(extraout_var_01,iVar3) + 0x108 +
                          (this->super_Atom).super_StuntDouble.storage_)),&local_b8);
    }
  }
  return;
}

Assistant:

void DirectionalAtom::setA(const RotMat3x3d& a, int snapshotNo) {
    ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] = a;

    if (atomType_->isMultipole()) {
      RotMat3x3d atrans = a.transpose();

      if (atomType_->isDipole()) {
        ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
            .dipole[localIndex_] = atrans * dipole_;
      }

      if (atomType_->isQuadrupole()) {
        ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
            .quadrupole[localIndex_] = atrans * quadrupole_ * a;
      }
    }
  }